

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_t.cpp
# Opt level: O2

bool __thiscall deci::value_equal_to_t::operator()(value_equal_to_t *this,value_t *lhs,value_t *rhs)

{
  int iVar1;
  int iVar2;
  runtime_error *this_00;
  bool bVar3;
  
  iVar1 = (*lhs->_vptr_value_t[1])(lhs);
  iVar2 = (*rhs->_vptr_value_t[1])(rhs);
  if (iVar1 != iVar2) {
    return false;
  }
  switch(iVar1) {
  case 0:
    bVar3 = (bool)(-((double)rhs[1]._vptr_value_t == (double)lhs[1]._vptr_value_t) & 1);
    break;
  case 1:
    iVar1 = std::__cxx11::string::compare((string *)(lhs + 1));
    bVar3 = iVar1 == 0;
    break;
  case 2:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Array comparison is not possible");
    goto LAB_0010379d;
  case 3:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Dictionary comparison is not possible");
    goto LAB_0010379d;
  case 4:
    bVar3 = lhs == rhs;
    break;
  case 5:
    bVar3 = lhs[1]._vptr_value_t == rhs[1]._vptr_value_t;
    break;
  case 6:
    bVar3 = true;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unknown data type");
LAB_0010379d:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return bVar3;
}

Assistant:

bool value_equal_to_t::operator() (const value_t* lhs, const value_t* rhs) const {
    value_t::type_t lhsType = lhs->Type();

    if (lhsType != rhs->Type()) {
      return false;
    }

    switch(lhsType) {
    case value_t::NUMBER:
      return static_cast<const number_t*>(lhs)->Value()
        == static_cast<const number_t*>(rhs)->Value();
    case value_t::STRING:
      return static_cast<const string_t*>(lhs)->Value().compare(
        static_cast<const string_t*>(rhs)->Value()
      ) == 0;
    case value_t::ARRAY:
      throw std::runtime_error("Array comparison is not possible");
    case value_t::DICTIONARY:
      throw std::runtime_error("Dictionary comparison is not possible");
    case value_t::FUNCTION:
      return lhs == rhs;
    case value_t::REFERENCE:
      return &(static_cast<const reference_t*>(lhs)->Dereference())
        == &(static_cast<const reference_t*>(rhs)->Dereference());
    case value_t::NOTHING:
      return true;
    default:
      throw std::runtime_error("Unknown data type");
    }
  }